

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O0

ON_XMLVariant * __thiscall
ON_PostEffect::GetParameter
          (ON_XMLVariant *__return_storage_ptr__,ON_PostEffect *this,wchar_t *param_name)

{
  int iVar1;
  ON_XMLNode *pOVar2;
  undefined4 extraout_var;
  undefined1 local_58 [8];
  ON_XMLParameters p;
  ON_XMLNode *pep_param_node;
  ON_XMLNode *pep_node;
  wchar_t *param_name_local;
  ON_PostEffect *this_local;
  ON_XMLVariant *value;
  
  ::ON_XMLVariant::ON_XMLVariant(__return_storage_ptr__);
  ::ON_XMLVariant::SetNull(__return_storage_ptr__);
  pOVar2 = CImpl::PepNode(this->_impl);
  if (pOVar2 != (ON_XMLNode *)0x0) {
    iVar1 = (*pOVar2->_vptr_ON_XMLNode[0x25])(pOVar2,L"state");
    p._private = (ON_XMLParametersPrivate *)CONCAT44(extraout_var,iVar1);
    if ((ON_XMLNode *)p._private != (ON_XMLNode *)0x0) {
      ON_XMLParameters::ON_XMLParameters((ON_XMLParameters *)local_58,(ON_XMLNode *)p._private);
      ON_XMLParameters::GetParam((ON_XMLParameters *)local_58,param_name,__return_storage_ptr__);
      ON_XMLParameters::~ON_XMLParameters((ON_XMLParameters *)local_58);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ON_XMLVariant ON_PostEffect::GetParameter(const wchar_t* param_name) const
{
  ON_XMLVariant value;
  value.SetNull();

  const ON_XMLNode* pep_node = _impl->PepNode();
  if (nullptr != pep_node)
  {
    const ON_XMLNode* pep_param_node = pep_node->GetNamedChild(ON_RDK_PEP_PARAMS);
    if (nullptr != pep_param_node)
    {
      ON_XMLParameters p(*pep_param_node);
      p.GetParam(param_name, value);
    }
  }

  return value;
}